

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O3

bool __thiscall
SwitchIRBuilder::TestAndAddStringCaseConst(SwitchIRBuilder *this,JITJavascriptString *str)

{
  int iVar1;
  List<JITJavascriptString_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StrSwitchCaseList *this_01;
  JITJavascriptString *local_20;
  JITJavascriptString *str_local;
  
  this_01 = this->m_strConstSwitchCases;
  local_20 = str;
  if (this_01 == (StrSwitchCaseList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                       ,0x30f,"(m_strConstSwitchCases)","m_strConstSwitchCases");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    this_01 = this->m_strConstSwitchCases;
  }
  bVar3 = JsUtil::ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>::
          Contains(&this_01->
                    super_ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>
                   ,&local_20);
  if (!bVar3) {
    this_00 = this->m_strConstSwitchCases;
    JsUtil::
    List<JITJavascriptString_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(this_00,0);
    iVar1 = (this_00->
            super_ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>).
            count;
    (this_00->super_ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>)
    .buffer[iVar1] = local_20;
    (this_00->super_ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>)
    .count = iVar1 + 1;
  }
  return bVar3;
}

Assistant:

bool
SwitchIRBuilder::TestAndAddStringCaseConst(JITJavascriptString * str)
{
    Assert(m_strConstSwitchCases);

    if (m_strConstSwitchCases->Contains(str))
    {
        return true;
    }
    else
    {
        m_strConstSwitchCases->Add(str);
        return false;
    }
}